

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMRangeImpl::receiveReplacedText(DOMRangeImpl *this,DOMNode *node)

{
  short sVar1;
  int iVar2;
  short type;
  DOMNode *node_local;
  DOMRangeImpl *this_local;
  
  if (node != (DOMNode *)0x0) {
    iVar2 = (*this->fStartContainer->_vptr_DOMNode[4])();
    sVar1 = (short)iVar2;
    if ((node == this->fStartContainer) &&
       ((((sVar1 == 3 || (sVar1 == 4)) || (sVar1 == 8)) || (sVar1 == 7)))) {
      this->fStartOffset = 0;
    }
    iVar2 = (*this->fEndContainer->_vptr_DOMNode[4])();
    sVar1 = (short)iVar2;
    if ((node == this->fEndContainer) &&
       (((sVar1 == 3 || (sVar1 == 4)) || ((sVar1 == 8 || (sVar1 == 7)))))) {
      this->fEndOffset = 0;
    }
  }
  return;
}

Assistant:

void DOMRangeImpl::receiveReplacedText(DOMNode* node)
{
    if (node == 0) return;

    short type = fStartContainer->getNodeType();
    if (node == fStartContainer
        && (type == DOMNode::TEXT_NODE
        || type == DOMNode::CDATA_SECTION_NODE
        || type == DOMNode::COMMENT_NODE
        || type == DOMNode::PROCESSING_INSTRUCTION_NODE))
    {
        fStartOffset = 0;
    }
    type = fEndContainer->getNodeType();
    if (node == fEndContainer
        && (type == DOMNode::TEXT_NODE
        || type == DOMNode::CDATA_SECTION_NODE
        || type == DOMNode::COMMENT_NODE
        || type == DOMNode::PROCESSING_INSTRUCTION_NODE))
    {
        fEndOffset = 0;
    }
}